

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

size_t __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,size_t pageToDecommit)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  uint pageCount;
  uint uVar8;
  BVIndex i;
  BVIndex BVar9;
  
  if (pageToDecommit == 0) {
LAB_006ff9ad:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x250,"(pageToDecommit != 0 && this->GetAvailablePageCount() > 0)",
                       "pageToDecommit != 0 && this->GetAvailablePageCount() > 0");
    if (!bVar2) goto LAB_006ffb0b;
    *puVar7 = 0;
  }
  else {
    uVar4 = GetAvailablePageCount(this);
    if (uVar4 == 0) goto LAB_006ff9ad;
  }
  uVar8 = 0;
  uVar4 = 0;
  BVar9 = 0;
  do {
    i = BVar9;
    BVar3 = BVStatic<272UL>::Test(&this->freePages,i);
    if (BVar3 == '\0') {
      if (uVar4 <= i && i - uVar4 != 0) {
        DecommitFreePagesInternal(this,uVar4,i - uVar4);
      }
      uVar4 = i + 1;
    }
    else {
      uVar8 = uVar8 + 1;
    }
    BVar9 = i + 1;
    uVar5 = GetAvailablePageCount(this);
  } while ((BVar9 < uVar5) && (uVar8 < pageToDecommit));
  if (uVar4 <= i) {
    DecommitFreePagesInternal(this,uVar4,BVar9 - uVar4);
  }
  uVar6 = this->freePageCount;
  if (uVar6 < uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x26b,"(decommitCount <= this->freePageCount)",
                       "decommitCount <= this->freePageCount");
    if (!bVar2) {
LAB_006ffb0b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    uVar6 = this->freePageCount;
  }
  this->decommitPageCount = this->decommitPageCount + uVar8;
  this->freePageCount = uVar6 - uVar8;
  return (ulong)uVar8;
}

Assistant:

size_t
PageSegmentBase<T>::DecommitFreePages(size_t pageToDecommit)
{
    Assert(pageToDecommit != 0 && this->GetAvailablePageCount() > 0);

    uint startIndex = 0, index = 0, decommitCount = 0;
    do
    {
        if (!this->TestInFreePagesBitVector(index))
        {
            if (startIndex < index)
            {
                uint pageCount = index - startIndex;
                this->DecommitFreePagesInternal(startIndex, pageCount);
            }
            startIndex = index + 1;
        }
        else
        {
            decommitCount++;
        }
    }
    while (++index < this->GetAvailablePageCount() && decommitCount < pageToDecommit);

    if (startIndex < index)
    {
        uint pageCount = index - startIndex;
        this->DecommitFreePagesInternal(startIndex, pageCount);
    }

    Assert(decommitCount <= this->freePageCount);
    this->decommitPageCount += decommitCount;
    this->freePageCount -= decommitCount;
    return decommitCount;
}